

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::LexFloat(AsciiParser *this,string *result)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  StreamReader *pSVar4;
  ostream *poVar5;
  uint64_t *puVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  char *pcVar11;
  ostringstream oVar12;
  ostringstream ss_e;
  stringstream ss;
  string local_350;
  ostringstream local_330;
  undefined7 uStack_32f;
  long local_320 [12];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pSVar4 = this->_sr;
  uVar9 = pSVar4->idx_ + 1;
  if (pSVar4->length_ < uVar9) {
LAB_0038746d:
    bVar10 = false;
    bVar3 = false;
  }
  else {
    oVar12 = *(ostringstream *)(pSVar4->binary_ + pSVar4->idx_);
    pSVar4->idx_ = uVar9;
    iVar2 = (this->_curr_cursor).col;
    (this->_curr_cursor).col = iVar2 + 1;
    if ((oVar12 != (ostringstream)0x2d) && (oVar12 != (ostringstream)0x2b)) {
      if ((byte)((char)oVar12 - 0x30U) < 10) {
        local_330 = oVar12;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
        bVar10 = true;
        goto LAB_00387530;
      }
      if (oVar12 == (ostringstream)0x2e) {
        bVar10 = false;
        uVar9 = pSVar4->idx_ - 1;
        bVar3 = true;
        if ((-1 < (long)uVar9) && (uVar9 <= pSVar4->length_)) {
          pSVar4->idx_ = uVar9;
          (this->_curr_cursor).col = iVar2;
          bVar3 = true;
          bVar10 = true;
        }
        goto LAB_00387532;
      }
      ::std::__cxx11::ostringstream::ostringstream(&local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"LexFloat",8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<(&local_330,0xb32);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,"Sign or `.` or 0-9 expected.",0x1c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream(&local_330);
      ::std::ios_base::~ios_base(local_2c0);
      goto LAB_0038746d;
    }
    local_330 = oVar12;
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
    pSVar4 = this->_sr;
    uVar9 = pSVar4->idx_ + 1;
    bVar10 = uVar9 <= pSVar4->length_;
    if (pSVar4->length_ < uVar9) {
LAB_00387530:
      bVar3 = false;
    }
    else {
      oVar12 = *(ostringstream *)(pSVar4->binary_ + pSVar4->idx_);
      pSVar4->idx_ = uVar9;
      if (oVar12 == (ostringstream)0x2e) {
        piVar1 = &(this->_curr_cursor).col;
        *piVar1 = *piVar1 + 1;
        local_330 = oVar12;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
        bVar3 = true;
      }
      else {
        bVar3 = false;
        if ((0 < (long)pSVar4->idx_) &&
           (uVar9 = pSVar4->idx_ - 1, bVar3 = false, uVar9 <= pSVar4->length_)) {
          pSVar4->idx_ = uVar9;
          goto LAB_00387530;
        }
      }
    }
  }
LAB_00387532:
  if (bVar10) {
    if (!bVar3) {
      pSVar4 = this->_sr;
      uVar9 = pSVar4->length_;
      uVar7 = pSVar4->idx_;
      if (uVar7 < uVar9) {
        while (puVar6 = &pSVar4->idx_, pSVar4->binary_[uVar7] != '\0') {
          if (uVar9 < uVar7 + 1) goto LAB_0038775e;
          oVar12 = *(ostringstream *)(pSVar4->binary_ + uVar7);
          *puVar6 = uVar7 + 1;
          if (9 < (byte)((char)oVar12 - 0x30U)) {
            if ((0 < (long)*puVar6) && (uVar9 = *puVar6 - 1, uVar9 <= pSVar4->length_)) {
              *puVar6 = uVar9;
            }
            break;
          }
          local_330 = oVar12;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
          pSVar4 = this->_sr;
          uVar9 = pSVar4->length_;
          uVar7 = pSVar4->idx_;
          if (uVar9 <= uVar7) break;
        }
      }
    }
    pSVar4 = this->_sr;
    uVar9 = pSVar4->idx_;
    if ((uVar9 < pSVar4->length_) && (pSVar4->binary_[uVar9] != '\0')) {
      if (pSVar4->length_ < uVar9 + 1) goto LAB_0038775e;
      oVar12 = *(ostringstream *)(pSVar4->binary_ + uVar9);
      pSVar4->idx_ = uVar9 + 1;
      if (oVar12 == (ostringstream)0x2e) {
        local_330 = oVar12;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
        pSVar4 = this->_sr;
        uVar9 = pSVar4->length_;
        uVar7 = pSVar4->idx_;
        if (uVar7 < uVar9) {
          do {
            if (pSVar4->binary_[uVar7] == '\0') break;
            if (uVar9 < uVar7 + 1) goto LAB_0038775e;
            oVar12 = *(ostringstream *)(pSVar4->binary_ + uVar7);
            pSVar4->idx_ = uVar7 + 1;
            if (9 < (byte)((char)oVar12 - 0x30U)) break;
            local_330 = oVar12;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
            pSVar4 = this->_sr;
            uVar9 = pSVar4->length_;
            uVar7 = pSVar4->idx_;
          } while (uVar7 < uVar9);
        }
      }
      else if (((byte)oVar12 & 0xdf) != 0x45) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)result,(string *)&local_330);
        if ((long *)CONCAT71(uStack_32f,local_330) != local_320) {
          operator_delete((long *)CONCAT71(uStack_32f,local_330),local_320[0] + 1);
        }
        pSVar4 = this->_sr;
        bVar10 = true;
        if ((0 < (long)pSVar4->idx_) && (uVar9 = pSVar4->idx_ - 1, uVar9 <= pSVar4->length_)) {
          pSVar4->idx_ = uVar9;
        }
        goto LAB_00387a0b;
      }
      pSVar4 = this->_sr;
      uVar9 = pSVar4->idx_;
      if ((uVar9 < pSVar4->length_) && (pSVar4->binary_[uVar9] != '\0')) {
        if (((byte)oVar12 & 0xdf) == 0x45) {
          local_330 = oVar12;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
          pSVar4 = this->_sr;
          uVar9 = pSVar4->idx_ + 1;
          if (pSVar4->length_ < uVar9) goto LAB_0038775e;
          oVar12 = *(ostringstream *)(pSVar4->binary_ + pSVar4->idx_);
          pSVar4->idx_ = uVar9;
          if ((oVar12 == (ostringstream)0x2d) || (oVar12 == (ostringstream)0x2b)) {
            local_330 = oVar12;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
            bVar10 = true;
          }
          else {
            if (9 < (byte)((char)oVar12 - 0x30U)) {
              ::std::__cxx11::ostringstream::ostringstream(&local_330);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_330,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_330,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_330,"LexFloat",8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<(&local_330,0xb8a);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              pcVar11 = "Empty `E\' is not allowed.";
              lVar8 = 0x19;
LAB_00387ba5:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_330,pcVar11,lVar8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(this,&local_350);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream(&local_330);
              ::std::ios_base::~ios_base(local_2c0);
              goto LAB_0038775e;
            }
            local_330 = oVar12;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1);
            bVar10 = false;
          }
          pSVar4 = this->_sr;
          uVar9 = pSVar4->length_;
          uVar7 = pSVar4->idx_;
          if (uVar7 < uVar9) {
            while (puVar6 = &pSVar4->idx_, pSVar4->binary_[uVar7] != '\0') {
              if (uVar9 < uVar7 + 1) goto LAB_0038775e;
              oVar12 = *(ostringstream *)(pSVar4->binary_ + uVar7);
              *puVar6 = uVar7 + 1;
              if ((byte)((char)oVar12 - 0x30U) < 10) {
                local_330 = oVar12;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1)
                ;
              }
              else {
                if ((oVar12 != (ostringstream)0x2d) && (oVar12 != (ostringstream)0x2b)) {
                  if ((0 < (long)*puVar6) && (uVar9 = *puVar6 - 1, uVar9 <= pSVar4->length_)) {
                    *puVar6 = uVar9;
                  }
                  break;
                }
                if (bVar10) {
                  ::std::__cxx11::ostringstream::ostringstream(&local_330);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_330,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_330,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_330,"LexFloat",8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_330,"():",3);
                  poVar5 = (ostream *)::std::ostream::operator<<(&local_330,0xb99);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                  pcVar11 = "No multiple exponential sign characters.";
                  lVar8 = 0x28;
                  goto LAB_00387ba5;
                }
                local_330 = oVar12;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_330,1)
                ;
                bVar10 = true;
              }
              pSVar4 = this->_sr;
              uVar9 = pSVar4->length_;
              uVar7 = pSVar4->idx_;
              if (uVar9 <= uVar7) break;
            }
          }
        }
        else if (uVar9 - 1 <= pSVar4->length_ && 0 < (long)uVar9) {
          pSVar4->idx_ = uVar9 - 1;
        }
      }
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::operator=((string *)result,(string *)&local_330);
    if ((long *)CONCAT71(uStack_32f,local_330) != local_320) {
      operator_delete((long *)CONCAT71(uStack_32f,local_330),local_320[0] + 1);
    }
    bVar10 = true;
  }
  else {
LAB_0038775e:
    bVar10 = false;
  }
LAB_00387a0b:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar10;
}

Assistant:

bool AsciiParser::LexFloat(std::string *result) {
  // FLOATVAL : ('+' or '-')? FLOAT
  // FLOAT
  //     :   ('0'..'9')+ '.' ('0'..'9')* EXPONENT?
  //     |   '.' ('0'..'9')+ EXPONENT?
  //     |   ('0'..'9')+ EXPONENT
  //     ;
  // EXPONENT : ('e'|'E') ('+'|'-')? ('0'..'9')+ ;

  std::stringstream ss;

  bool has_sign{false};
  bool leading_decimal_dots{false};
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign, '.' or [0-9]
    if ((sc == '+') || (sc == '-')) {
      ss << sc;
      has_sign = true;

      char c;
      if (!Char1(&c)) {
        return false;
      }

      if (c == '.') {
        // ok. something like `+.7`, `-.53`
        leading_decimal_dots = true;
        _curr_cursor.col++;
        ss << c;

      } else {
        // unwind and continue
        _sr->seek_from_current(-1);
      }

    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
      ss << sc;
    } else if (sc == '.') {
      // ok but rescan again in 2.
      leading_decimal_dots = true;
      if (!Rewind(1)) {
        return false;
      }
      _curr_cursor.col--;
    } else {
      PUSH_ERROR_AND_RETURN("Sign or `.` or 0-9 expected.");
    }
  }

  (void)has_sign;

  // 1. Read the integer part
  char curr;
  if (!leading_decimal_dots) {
    // std::cout << "1 read int part: ss = " << ss.str() << "\n";

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      // std::cout << "1 curr = " << curr << "\n";
      if ((curr >= '0') && (curr <= '9')) {
        // continue
        ss << curr;
      } else {
        _sr->seek_from_current(-1);
        break;
      }
    }
  }

  if (Eof()) {
    (*result) = ss.str();
    return true;
  }

  if (!Char1(&curr)) {
    return false;
  }

  // std::cout << "before 2: ss = " << ss.str() << ", curr = " << curr <<
  // "\n";

  // 2. Read the decimal part
  if (curr == '.') {
    ss << curr;

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      if ((curr >= '0') && (curr <= '9')) {
        ss << curr;
      } else {
        break;
      }
    }

  } else if ((curr == 'e') || (curr == 'E')) {
    // go to 3.
  } else {
    // end
    (*result) = ss.str();
    _sr->seek_from_current(-1);
    return true;
  }

  if (Eof()) {
    (*result) = ss.str();
    return true;
  }

  // 3. Read the exponent part
  bool has_exp_sign{false};
  if ((curr == 'e') || (curr == 'E')) {
    ss << curr;

    if (!Char1(&curr)) {
      return false;
    }

    if ((curr == '+') || (curr == '-')) {
      // exp sign
      ss << curr;
      has_exp_sign = true;

    } else if ((curr >= '0') && (curr <= '9')) {
      // ok
      ss << curr;
    } else {
      // Empty E is not allowed.
      PUSH_ERROR_AND_RETURN("Empty `E' is not allowed.");
    }

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      if ((curr >= '0') && (curr <= '9')) {
        // ok
        ss << curr;

      } else if ((curr == '+') || (curr == '-')) {
        if (has_exp_sign) {
          // No multiple sign characters
          PUSH_ERROR_AND_RETURN("No multiple exponential sign characters.");
        }

        ss << curr;
        has_exp_sign = true;
      } else {
        // end
        _sr->seek_from_current(-1);
        break;
      }
    }
  } else {
    _sr->seek_from_current(-1);
  }

  (*result) = ss.str();
  return true;
}